

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O0

void expand(TidyPrintImpl *pprint,uint len)

{
  uint *puVar1;
  uint local_24;
  uint buflen;
  uint *ip;
  uint len_local;
  TidyPrintImpl *pprint_local;
  
  local_24 = pprint->lbufsize;
  if (local_24 == 0) {
    local_24 = 0x100;
  }
  for (; local_24 <= len; local_24 = local_24 << 1) {
  }
  puVar1 = (uint *)(*pprint->allocator->vtbl->realloc)
                             (pprint->allocator,pprint->linebuf,(ulong)local_24 << 2);
  if (puVar1 != (uint *)0x0) {
    memset(puVar1 + pprint->lbufsize,0,(ulong)(local_24 - pprint->lbufsize) << 2);
    pprint->lbufsize = local_24;
    pprint->linebuf = puVar1;
  }
  return;
}

Assistant:

static void expand( TidyPrintImpl* pprint, uint len )
{
    uint* ip;
    uint buflen = pprint->lbufsize;

    if ( buflen == 0 )
        buflen = 256;
    while ( len >= buflen )
        buflen *= 2;

    ip = (uint*) TidyRealloc( pprint->allocator, pprint->linebuf, buflen*sizeof(uint) );
    if ( ip )
    {
      TidyClearMemory( ip+pprint->lbufsize, 
                       (buflen-pprint->lbufsize)*sizeof(uint) );
      pprint->lbufsize = buflen;
      pprint->linebuf = ip;
    }
}